

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_Republish(UA_Server *server,UA_Session *session,UA_RepublishRequest *request,
                      UA_RepublishResponse *response)

{
  UA_StatusCode UVar1;
  UA_Subscription *pUVar2;
  uint local_78;
  uint local_70;
  uint local_6c;
  UA_NotificationMessageEntry *local_60;
  UA_NotificationMessageEntry *entry;
  UA_Subscription *sub;
  UA_RepublishResponse *response_local;
  UA_RepublishRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_70 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_6c = 0;
    }
    else {
      local_6c = session->channel->connection->sockfd;
    }
    local_70 = local_6c;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing RepublishRequest"
               ,(ulong)local_70,(ulong)local_78,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  pUVar2 = UA_Session_getSubscriptionByID(session,request->subscriptionId);
  if (pUVar2 == (UA_Subscription *)0x0) {
    (response->responseHeader).serviceResult = 0x80280000;
  }
  else {
    pUVar2->currentLifetimeCount = 0;
    for (local_60 = (pUVar2->retransmissionQueue).tqh_first;
        (local_60 != (UA_NotificationMessageEntry *)0x0 &&
        ((local_60->message).sequenceNumber != request->retransmitSequenceNumber));
        local_60 = (local_60->listEntry).tqe_next) {
    }
    if (local_60 == (UA_NotificationMessageEntry *)0x0) {
      (response->responseHeader).serviceResult = 0x807b0000;
    }
    else {
      UVar1 = UA_NotificationMessage_copy(&local_60->message,&response->notificationMessage);
      (response->responseHeader).serviceResult = UVar1;
    }
  }
  return;
}

Assistant:

void Service_Republish(UA_Server *server, UA_Session *session, const UA_RepublishRequest *request,
                       UA_RepublishResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing RepublishRequest");
    /* get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if (!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;

    /* Find the notification in the retransmission queue  */
    UA_NotificationMessageEntry *entry;
    TAILQ_FOREACH(entry, &sub->retransmissionQueue, listEntry) {
        if(entry->message.sequenceNumber == request->retransmitSequenceNumber)
            break;
    }
    if(entry)
        response->responseHeader.serviceResult =
            UA_NotificationMessage_copy(&entry->message, &response->notificationMessage);
    else
      response->responseHeader.serviceResult = UA_STATUSCODE_BADMESSAGENOTAVAILABLE;
}